

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dict2pid.c
# Opt level: O0

void compress_table(s3ssid_t *uncomp_tab,s3ssid_t *com_tab,s3cipid_t *ci_map,int32 n_ci)

{
  bool bVar1;
  bool bVar2;
  int local_30;
  int local_2c;
  int32 tmp_r;
  int32 r;
  int32 found;
  int32 n_ci_local;
  s3cipid_t *ci_map_local;
  s3ssid_t *com_tab_local;
  s3ssid_t *uncomp_tab_local;
  
  for (local_2c = 0; local_2c < n_ci; local_2c = local_2c + 1) {
    com_tab[local_2c] = 0xffff;
    ci_map[local_2c] = -1;
  }
  local_2c = 0;
  do {
    if (n_ci <= local_2c) {
      return;
    }
    bVar1 = false;
    local_30 = 0;
    while( true ) {
      bVar2 = false;
      if (local_30 < local_2c) {
        bVar2 = com_tab[local_30] != 0xffff;
      }
      if (!bVar2) goto LAB_00130a3b;
      if (uncomp_tab[local_2c] == com_tab[local_30]) break;
      local_30 = local_30 + 1;
    }
    bVar1 = true;
    ci_map[local_2c] = (s3cipid_t)local_30;
LAB_00130a3b:
    if (!bVar1) {
      com_tab[local_30] = uncomp_tab[local_2c];
      ci_map[local_2c] = (s3cipid_t)local_30;
    }
    local_2c = local_2c + 1;
  } while( true );
}

Assistant:

void
compress_table(s3ssid_t * uncomp_tab, s3ssid_t * com_tab,
               s3cipid_t * ci_map, int32 n_ci)
{
    int32 found;
    int32 r;
    int32 tmp_r;

    for (r = 0; r < n_ci; r++) {
        com_tab[r] = BAD_S3SSID;
        ci_map[r] = BAD_S3CIPID;
    }
    /** Compress this map */
    for (r = 0; r < n_ci; r++) {

        found = 0;
        for (tmp_r = 0; tmp_r < r && com_tab[tmp_r] != BAD_S3SSID; tmp_r++) {   /* If it appears before, just filled in cimap; */
            if (uncomp_tab[r] == com_tab[tmp_r]) {
                found = 1;
                ci_map[r] = tmp_r;
                break;
            }
        }

        if (found == 0) {
            com_tab[tmp_r] = uncomp_tab[r];
            ci_map[r] = tmp_r;
        }
    }
}